

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetOwnPropertyNames2(JSContext *ctx,JSValue obj1,int flags,int kind)

{
  JSAtom prop;
  JSValue JVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue this_obj;
  int64_t local_a8;
  uint32_t len;
  JSPropertyEnum *local_88;
  ulong local_80;
  int local_78;
  uint local_74;
  JSPropertyEnum *atoms;
  JSPropertyDescriptor desc;
  JSValueUnion p;
  
  JVar10 = JS_ToObject(ctx,obj1);
  p = JVar10.u;
  if ((int)JVar10.tag == 6) {
    iVar6 = 6;
    uVar8 = 0;
    uVar7 = 0;
    goto LAB_0013975d;
  }
  iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&atoms,&len,(JSObject *)p.ptr,flags & 0xffffffef);
  if (iVar2 == 0) {
    local_78 = kind;
    local_74 = flags;
    JVar11 = JS_NewArray(ctx);
    iVar6 = JVar11.tag;
    JVar5 = JVar11.u;
    uVar8 = (ulong)JVar5.ptr >> 0x20;
    local_88 = atoms;
    local_80 = (ulong)len;
    uVar3 = JVar11.u._0_4_;
    if ((int)JVar11.tag == 6) goto LAB_0013971f;
    uVar7 = 0;
    uVar9 = 0;
    while( true ) {
      local_a8 = JVar10.tag;
      if (local_80 == uVar7) break;
      prop = local_88[uVar7].atom;
      if ((local_74 & 0x10) == 0) {
LAB_00139550:
        JVar1.tag = local_a8;
        JVar1.u.ptr = p.ptr;
        if (local_78 == 1) {
          JVar10 = JS_GetPropertyInternal(ctx,JVar10,prop,JVar10,0);
LAB_0013967c:
          if ((int)JVar10.tag != 6) {
LAB_0013968c:
            iVar2 = JS_CreateDataPropertyUint32(ctx,JVar11,(ulong)uVar9,JVar10,0);
            if (-1 < iVar2) {
              uVar9 = uVar9 + 1;
              JVar10 = JVar1;
              goto LAB_001396bf;
            }
          }
        }
        else {
          if (local_78 != 2) {
            JVar10 = JS_AtomToValue(ctx,prop);
            goto LAB_0013967c;
          }
          JVar10 = JS_NewArray(ctx);
          if ((int)JVar10.tag != 6) {
            JVar12 = JS_AtomToValue(ctx,prop);
            if (((((int)JVar12.tag == 6) ||
                 (iVar2 = JS_CreateDataPropertyUint32(ctx,JVar10,0,JVar12,0x4000), iVar2 < 0)) ||
                (JVar12.tag = local_a8, JVar12.u.ptr = p.ptr, this_obj.tag = local_a8,
                this_obj.u.ptr = p.ptr, JVar12 = JS_GetPropertyInternal(ctx,JVar12,prop,this_obj,0),
                (int)JVar12.tag == 6)) ||
               (iVar2 = JS_CreateDataPropertyUint32(ctx,JVar10,1,JVar12,0x4000), iVar2 < 0)) {
              JS_FreeValue(ctx,JVar10);
              goto LAB_0013970b;
            }
            goto LAB_0013968c;
          }
        }
LAB_0013970b:
        JVar10.tag = local_a8;
        JVar10.u.ptr = p.ptr;
        goto LAB_0013971f;
      }
      iVar4 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)JVar10.u.ptr,prop);
      iVar2 = 2;
      if ((-1 < iVar4) && (iVar2 = 5, iVar4 != 0)) {
        js_free_desc(ctx,&desc);
        iVar2 = 5;
        if (((byte)desc.flags & 4) != 0) goto LAB_00139550;
      }
      if (iVar2 != 5) {
        if (iVar2 == 2) goto LAB_0013971f;
        uVar8 = 0;
        uVar7 = 0;
        goto LAB_0013975d;
      }
LAB_001396bf:
      uVar7 = uVar7 + 1;
    }
    uVar7 = (ulong)JVar5.ptr & 0xffffffff00000000;
    uVar8 = (ulong)JVar5.ptr & 0xffffffff;
  }
  else {
    local_88 = atoms;
    iVar6 = 3;
    local_80 = (ulong)len;
    uVar3 = 0;
    uVar8 = 0;
LAB_0013971f:
    JVar11.u.ptr = (void *)((ulong)uVar3 | uVar8 << 0x20);
    JVar11.tag = iVar6;
    JS_FreeValue(ctx,JVar11);
    iVar6 = 6;
    uVar8 = 0;
    uVar7 = 0;
  }
  js_free_prop_enum(ctx,local_88,(uint32_t)local_80);
  JS_FreeValue(ctx,JVar10);
LAB_0013975d:
  JVar13.tag = iVar6;
  JVar13.u.ptr = (void *)(uVar8 | uVar7);
  return JVar13;
}

Assistant:

static JSValue JS_GetOwnPropertyNames2(JSContext *ctx, JSValueConst obj1,
                                       int flags, int kind)
{
    JSValue obj, r, val, key, value;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i, j;

    r = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, obj1);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, flags & ~JS_GPN_ENUM_ONLY))
        goto exception;
    r = JS_NewArray(ctx);
    if (JS_IsException(r))
        goto exception;
    for(j = i = 0; i < len; i++) {
        JSAtom atom = atoms[i].atom;
        if (flags & JS_GPN_ENUM_ONLY) {
            JSPropertyDescriptor desc;
            int res;

            /* Check if property is still enumerable */
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
            if (res < 0)
                goto exception;
            if (!res)
                continue;
            js_free_desc(ctx, &desc);
            if (!(desc.flags & JS_PROP_ENUMERABLE))
                continue;
        }
        switch(kind) {
        default:
        case JS_ITERATOR_KIND_KEY:
            val = JS_AtomToValue(ctx, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_VALUE:
            val = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_KEY_AND_VALUE:
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto exception;
            key = JS_AtomToValue(ctx, atom);
            if (JS_IsException(key))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 0, key, JS_PROP_THROW) < 0)
                goto exception1;
            value = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(value))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 1, value, JS_PROP_THROW) < 0)
                goto exception1;
            break;
        }
        if (JS_CreateDataPropertyUint32(ctx, r, j++, val, 0) < 0)
            goto exception;
    }
    goto done;

exception1:
    JS_FreeValue(ctx, val);
exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
done:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, obj);
    return r;
}